

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DGXMLScanner::scanDocTypeDecl(DGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  short *psVar1;
  DocTypeHandler *pDVar2;
  MemoryManager *pMVar3;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar4;
  Grammar *pGVar5;
  GrammarResolver *this_02;
  XMLValidator *pXVar6;
  XMLStringPool *pXVar7;
  bool bVar8;
  bool bVar9;
  XMLCh XVar10;
  XMLCh XVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  XMLBuffer *toFill;
  undefined4 extraout_var;
  DTDElementDecl *this_03;
  ulong uVar15;
  XMLSize_t XVar16;
  XMLBuffer *pubIdToFill;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  InputSource *pIVar17;
  undefined4 extraout_var_03;
  DTDGrammar *pDVar18;
  XMLReader *pXVar19;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLEntityDecl *this_04;
  XMLCh *pXVar20;
  RuntimeException *this_05;
  undefined4 extraout_var_07;
  MemoryManager **ppMVar21;
  byte bVar22;
  DTDElementDecl *pDVar23;
  size_t sVar24;
  XMLCh *pXVar25;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar26;
  InputSource *pIVar27;
  XMLCh *local_120;
  char16_t *local_118;
  bool skippedSomething;
  InputSource *srcUsed;
  DTDElementDecl *local_100;
  XMLBuffer *local_f8;
  XMLBuffer *local_f0;
  ArrayJanitor<char16_t> janPubId;
  ArrayJanitor<char16_t> janSysId;
  XMLBufBid bbRootName;
  XMLCh gDTDStr [4];
  int colonPosition;
  DTDScanner dtdScanner;
  undefined4 extraout_var_02;
  undefined4 extraout_var_06;
  
  pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
  if (pDVar2 != (DocTypeHandler *)0x0) {
    (*pDVar2->_vptr_DocTypeHandler[0xc])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  ReaderMgr::skipPastSpaces(this_00,&skippedSomething,false);
  if (skippedSomething == false) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    do {
      XVar10 = ReaderMgr::getNextChar(this_00);
      if (XVar10 == L'\0') {
        return;
      }
    } while (XVar10 != L'>');
    return;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_01);
  bVar8 = (this->super_XMLScanner).fDoNamespaces;
  toFill->fIndex = 0;
  pXVar19 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  if (bVar8 == true) {
    bVar8 = XMLReader::getQName(pXVar19,toFill,&colonPosition);
  }
  else {
    bVar8 = XMLReader::getName(pXVar19,toFill,false);
  }
  if (bVar8 == false) {
    if (toFill->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,NoRootElemInDOCTYPE);
    }
    else {
      pXVar20 = toFill->fBuffer;
      pXVar20[toFill->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidRootElemInDOCTYPE,pXVar20,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar10 = ReaderMgr::getNextChar(this_00);
      if (XVar10 == L'\0') break;
    } while (XVar10 != L'>');
    goto LAB_002974e5;
  }
  pXVar20 = toFill->fBuffer;
  pXVar20[toFill->fIndex] = L'\0';
  pMVar3 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar3->_vptr_MemoryManager[4])(pMVar3,(this->super_XMLScanner).fRootElemName);
  pMVar3 = (this->super_XMLScanner).fMemoryManager;
  sVar24 = 0;
  do {
    psVar1 = (short *)((long)pXVar20 + sVar24);
    sVar24 = sVar24 + 2;
  } while (*psVar1 != 0);
  iVar12 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar24);
  memcpy((XMLCh *)CONCAT44(extraout_var,iVar12),pXVar20,sVar24);
  (this->super_XMLScanner).fRootElemName = (XMLCh *)CONCAT44(extraout_var,iVar12);
  ppMVar21 = &(this->super_XMLScanner).fGrammarPoolMemoryManager;
  if ((this->super_XMLScanner).fUseCachedGrammar != false) {
    ppMVar21 = &(this->super_XMLScanner).fMemoryManager;
  }
  pMVar3 = *ppMVar21;
  this_03 = (DTDElementDecl *)XMemory::operator_new(0x58,pMVar3);
  pXVar20 = toFill->fBuffer;
  pXVar20[toFill->fIndex] = L'\0';
  DTDElementDecl::DTDElementDecl
            (this_03,pXVar20,(this->super_XMLScanner).fEmptyNamespaceId,Any,pMVar3);
  (this_03->super_XMLElementDecl).fCreateReason = AsRootElem;
  (this_03->super_XMLElementDecl).fExternalElement = true;
  if ((this->super_XMLScanner).fUseCachedGrammar == false) {
    pGVar5 = (this->super_XMLScanner).fGrammar;
    (*(pGVar5->super_XSerializable)._vptr_XSerializable[0x11])(pGVar5,this_03,0);
    pDVar23 = (DTDElementDecl *)0x0;
  }
  else {
    pNVar4 = this->fDTDElemNonDeclPool;
    pXVar20 = toFill->fBuffer;
    pXVar20[toFill->fIndex] = L'\0';
    if (pNVar4->fIdCounter != 0) {
      uVar15 = (ulong)(ushort)*pXVar20;
      if (uVar15 == 0) {
        uVar15 = 0;
      }
      else {
        XVar10 = pXVar20[1];
        if (XVar10 != L'\0') {
          pXVar25 = pXVar20 + 2;
          do {
            uVar15 = (ulong)(ushort)XVar10 + (uVar15 >> 0x18) + uVar15 * 0x26;
            XVar10 = *pXVar25;
            pXVar25 = pXVar25 + 1;
          } while (XVar10 != L'\0');
        }
        uVar15 = uVar15 % (pNVar4->fBucketList).fHashModulus;
      }
      pRVar26 = (pNVar4->fBucketList).fBucketList[uVar15];
      if (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar8 = StringHasher::equals
                            ((StringHasher *)&(pNVar4->fBucketList).field_0x30,pXVar20,pRVar26->fKey
                            );
          if (bVar8) {
            if (pRVar26->fData != (DTDElementDecl *)0x0) {
              XVar16 = (pRVar26->fData->super_XMLElementDecl).fId;
              pDVar23 = this_03;
              goto LAB_00296e5d;
            }
            break;
          }
          pRVar26 = pRVar26->fNext;
        } while (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
    }
    XVar16 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_03);
    pDVar23 = (DTDElementDecl *)0x0;
LAB_00296e5d:
    (this_03->super_XMLElementDecl).fId = XVar16;
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar8 = ReaderMgr::skippedChar(this_00,L'>');
  if (bVar8) {
    pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
    if (pDVar2 != (DocTypeHandler *)0x0) {
      (*pDVar2->_vptr_DocTypeHandler[4])(pDVar2,this_03,0,0,0,0);
    }
  }
  else {
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
    }
    local_100 = pDVar23;
    DTDScanner::DTDScanner
              (&dtdScanner,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
               (this->super_XMLScanner).fDocTypeHandler,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo(&dtdScanner,&this->super_XMLScanner,this_00,this_01);
    XVar10 = ReaderMgr::peekNextChar(this_00);
    if (XVar10 == L'[') {
      bVar8 = true;
      local_120 = (char16_t *)0x0;
      local_118 = (char16_t *)0x0;
LAB_00297079:
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janSysId,local_120,(this->super_XMLScanner).fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janPubId,local_118,(this->super_XMLScanner).fMemoryManager);
      pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
      if (pDVar2 == (DocTypeHandler *)0x0) {
        bVar22 = 1;
        if (bVar8 != false) goto LAB_002970ed;
LAB_00297154:
        bVar8 = ReaderMgr::skippedChar(this_00,L'>');
        if (!bVar8) {
          bVar8 = ReaderMgr::skippedChar(this_00,L']');
          if ((bVar8) && (bVar8 = ReaderMgr::skippedChar(this_00,L'>'), bVar8)) {
            XMLScanner::emitError(&this->super_XMLScanner,ExtraCloseSquare);
          }
          else {
            XMLScanner::emitError(&this->super_XMLScanner,UnterminatedDOCTYPE);
            do {
              XVar11 = ReaderMgr::getNextChar(this_00);
              if (XVar11 == L'>') break;
            } while (XVar11 != L'\0');
          }
        }
        if (XVar10 != L'[') {
          srcUsed = (InputSource *)0x0;
          if ((bVar22 & (this->super_XMLScanner).fUseCachedGrammar) == 1) {
            iVar12 = (*(this->super_XMLScanner).super_XMLBufferFullHandler.
                       _vptr_XMLBufferFullHandler[0x11])(this,local_120,local_118);
            pIVar17 = (InputSource *)CONCAT44(extraout_var_02,iVar12);
            srcUsed = pIVar17;
            if (pIVar17 == (InputSource *)0x0) goto LAB_00297293;
            this_02 = (this->super_XMLScanner).fGrammarResolver;
            iVar12 = (*pIVar17->_vptr_InputSource[5])(pIVar17);
            pDVar18 = (DTDGrammar *)
                      GrammarResolver::getGrammar(this_02,(XMLCh *)CONCAT44(extraout_var_03,iVar12))
            ;
            pIVar27 = pIVar17;
            if ((pDVar18 == (DTDGrammar *)0x0) ||
               (iVar12 = (*(pDVar18->super_Grammar).super_XSerializable._vptr_XSerializable[5])
                                   (pDVar18), iVar12 != 0)) goto LAB_00297296;
            this->fDTDGrammar = pDVar18;
            (this->super_XMLScanner).fGrammar = (Grammar *)pDVar18;
            pXVar6 = (this->super_XMLScanner).fValidator;
            (*pXVar6->_vptr_XMLValidator[0xb])(pXVar6,pDVar18);
            pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
            if (pDVar2 != (DocTypeHandler *)0x0) {
              (*pDVar2->_vptr_DocTypeHandler[0x10])();
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[10])();
            }
          }
          else {
LAB_00297293:
            pIVar27 = (InputSource *)0x0;
LAB_00297296:
            pIVar17 = pIVar27;
            if (((this->super_XMLScanner).fLoadExternalDTD != false) ||
               ((this->super_XMLScanner).fValidate == true)) {
              XVar16 = (this->super_XMLScanner).fLowWaterMark;
              bVar8 = (this->super_XMLScanner).fCalculateSrcOfs;
              if (srcUsed == (InputSource *)0x0) {
                pXVar19 = ReaderMgr::createReader
                                    (this_00,local_120,local_118,false,RefFrom_NonLiteral,
                                     Type_General,Source_External,&srcUsed,bVar8,XVar16,
                                     (this->super_XMLScanner).fDisableDefaultEntityResolution);
                pIVar17 = srcUsed;
                if (pIVar27 != (InputSource *)0x0) {
                  (*pIVar27->_vptr_InputSource[1])(pIVar27);
                }
              }
              else {
                pXVar19 = ReaderMgr::createReader
                                    (this_00,srcUsed,false,RefFrom_NonLiteral,Type_General,
                                     Source_External,bVar8,XVar16);
              }
              if (pXVar19 == (XMLReader *)0x0) {
                this_05 = (RuntimeException *)__cxa_allocate_exception(0x30);
                if (srcUsed != (InputSource *)0x0) {
                  iVar12 = (*srcUsed->_vptr_InputSource[5])();
                  local_120 = (XMLCh *)CONCAT44(extraout_var_07,iVar12);
                }
                RuntimeException::RuntimeException
                          (this_05,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                           ,0x40a,Gen_CouldNotOpenDTD,local_120,(XMLCh *)0x0,(XMLCh *)0x0,
                           (XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
                __cxa_throw(this_05,&RuntimeException::typeinfo,XMLException::~XMLException);
              }
              if ((this->super_XMLScanner).fToCacheGrammar == true) {
                pXVar7 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar12 = (*srcUsed->_vptr_InputSource[5])();
                uVar13 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])
                                   (pXVar7,CONCAT44(extraout_var_04,iVar12));
                pXVar7 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar12 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])
                                   (pXVar7,(ulong)uVar13);
                GrammarResolver::orphanGrammar((this->super_XMLScanner).fGrammarResolver,L"[dtd]");
                iVar14 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable).
                           _vptr_XSerializable[0x16])();
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar14) + 0x50))
                          ((long *)CONCAT44(extraout_var_05,iVar14),iVar12);
                GrammarResolver::putGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (this->super_XMLScanner).fGrammar);
              }
              builtin_memcpy(gDTDStr,L"DTD",8);
              this_04 = (XMLEntityDecl *)
                        XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
              XMLEntityDecl::XMLEntityDecl(this_04,gDTDStr,(this->super_XMLScanner).fMemoryManager);
              (this_04->super_XSerializable)._vptr_XSerializable =
                   (_func_int **)&PTR__XMLEntityDecl_00408758;
              *(undefined2 *)&this_04[1].super_XSerializable._vptr_XSerializable = 0;
              *(undefined1 *)((long)&this_04[1].super_XSerializable._vptr_XSerializable + 2) = 0;
              if (this_04->fSystemId != (XMLCh *)0x0) {
                (*this_04->fMemoryManager->_vptr_MemoryManager[4])();
              }
              if (local_120 == (char16_t *)0x0) {
                pXVar20 = (XMLCh *)0x0;
              }
              else {
                sVar24 = 0;
                do {
                  psVar1 = (short *)((long)local_120 + sVar24);
                  sVar24 = sVar24 + 2;
                } while (*psVar1 != 0);
                iVar12 = (*this_04->fMemoryManager->_vptr_MemoryManager[3])
                                   (this_04->fMemoryManager,sVar24);
                pXVar20 = (XMLCh *)CONCAT44(extraout_var_06,iVar12);
                memcpy(pXVar20,local_120,sVar24);
              }
              this_04->fSystemId = pXVar20;
              this_04->fIsExternal = true;
              pXVar19->fThrowAtEnd = true;
              ReaderMgr::pushReaderAdoptEntity(this_00,pXVar19,this_04,true);
              DTDScanner::scanExtSubsetDecl(&dtdScanner,false,true);
            }
            if (pIVar17 == (InputSource *)0x0) goto LAB_002974b1;
          }
          (*pIVar17->_vptr_InputSource[1])(pIVar17);
        }
      }
      else {
        (*pDVar2->_vptr_DocTypeHandler[4])
                  (pDVar2,this_03,local_118,local_120,(ulong)bVar8,(ulong)(XVar10 != L'['));
        bVar22 = 1;
        if (bVar8 == false) goto LAB_00297154;
LAB_002970ed:
        ReaderMgr::getNextChar(this_00);
        XMLScanner::checkInternalDTD(&this->super_XMLScanner,XVar10 != L'[',local_120,local_118);
        bVar8 = DTDScanner::scanInternalSubset(&dtdScanner);
        if (bVar8) {
          XVar16 = ReaderMgr::getReaderDepth(this_00);
          if (1 < XVar16) {
            XMLScanner::emitError(&this->super_XMLScanner,PEPropogated);
            ReaderMgr::cleanStackBackTo(this_00,1);
          }
          ReaderMgr::skipPastSpaces(this_00);
          bVar22 = 0;
          goto LAB_00297154;
        }
        do {
          XVar10 = ReaderMgr::getNextChar(this_00);
          if (XVar10 == L'\0') break;
        } while (XVar10 != L'>');
      }
LAB_002974b1:
      ArrayJanitor<char16_t>::~ArrayJanitor(&janPubId);
      ArrayJanitor<char16_t>::~ArrayJanitor(&janSysId);
    }
    else {
      (this->super_XMLScanner).fHasNoDTD = false;
      pubIdToFill = XMLBufferMgr::bidOnBuffer(this_01);
      janSysId.fData = (char16_t *)pubIdToFill;
      janSysId.fMemoryManager = (MemoryManager *)this_01;
      local_f0 = XMLBufferMgr::bidOnBuffer(this_01);
      local_f8 = pubIdToFill;
      janPubId.fData = (char16_t *)local_f0;
      janPubId.fMemoryManager = (MemoryManager *)this_01;
      bVar9 = DTDScanner::scanId(&dtdScanner,pubIdToFill,local_f0,IDType_External);
      if (bVar9) {
        pXVar20 = local_f8->fBuffer;
        pXVar20[local_f8->fIndex] = L'\0';
        pMVar3 = (this->super_XMLScanner).fMemoryManager;
        sVar24 = 0;
        do {
          psVar1 = (short *)((long)pXVar20 + sVar24);
          sVar24 = sVar24 + 2;
        } while (*psVar1 != 0);
        iVar12 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar24);
        local_118 = (char16_t *)CONCAT44(extraout_var_00,iVar12);
        memcpy(local_118,pXVar20,sVar24);
        pXVar20 = local_f0->fBuffer;
        pXVar20[local_f0->fIndex] = L'\0';
        pMVar3 = (this->super_XMLScanner).fMemoryManager;
        sVar24 = 0;
        do {
          psVar1 = (short *)((long)pXVar20 + sVar24);
          sVar24 = sVar24 + 2;
        } while (*psVar1 != 0);
        iVar12 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar24);
        local_120 = (XMLCh *)CONCAT44(extraout_var_01,iVar12);
        memcpy(local_120,pXVar20,sVar24);
        ReaderMgr::skipPastSpaces(this_00);
        XVar11 = ReaderMgr::peekNextChar(this_00);
        bVar8 = XVar11 == L'[';
      }
      else {
        do {
          XVar11 = ReaderMgr::getNextChar(this_00);
          if (XVar11 == L'\0') break;
        } while (XVar11 != L'>');
        local_120 = (char16_t *)0x0;
        local_118 = (char16_t *)0x0;
        bVar8 = false;
      }
      XMLBufferMgr::releaseBuffer(this_01,local_f0);
      XMLBufferMgr::releaseBuffer(this_01,local_f8);
      if (bVar9) goto LAB_00297079;
    }
    DTDScanner::~DTDScanner(&dtdScanner);
    pDVar23 = local_100;
  }
  if (pDVar23 != (DTDElementDecl *)0x0) {
    (*(pDVar23->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])(pDVar23);
  }
LAB_002974e5:
  XMLBufferMgr::releaseBuffer(this_01,toFill);
  return;
}

Assistant:

void DGXMLScanner::scanDocTypeDecl()
{
    if (fDocTypeHandler)
        fDocTypeHandler->resetDocType();

    // There must be some space after DOCTYPE
    bool skippedSomething;
    fReaderMgr.skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        emitError(XMLErrs::ExpectedWhitespace);

        // Just skip the Doctype declaration and return
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Get a buffer for the root element
    XMLBufBid bbRootName(&fBufMgr);

    //  Get a name from the input, which should be the name of the root
    //  element of the upcoming content.
    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbRootName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbRootName.getBuffer());
    if (!validName)
    {
        if (bbRootName.isEmpty())
            emitError(XMLErrs::NoRootElemInDOCTYPE);
        else
            emitError(XMLErrs::InvalidRootElemInDOCTYPE, bbRootName.getRawBuffer());
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    //  Store the root element name for later check
    setRootElemName(bbRootName.getRawBuffer());

    //  This element obviously is not going to exist in the element decl
    //  pool yet, but we need to call docTypeDecl. So force it into
    //  the element decl pool, marked as being there because it was in
    //  the DOCTYPE. Later, when its declared, the status will be updated.
    //
    //  Only do this if we are not reusing the validator! If we are reusing,
    //  then look it up instead. It has to exist!
    MemoryManager* const  rootDeclMgr =
        fUseCachedGrammar ? fMemoryManager : fGrammarPoolMemoryManager;

    DTDElementDecl* rootDecl = new (rootDeclMgr) DTDElementDecl
    (
        bbRootName.getRawBuffer()
        , fEmptyNamespaceId
        , DTDElementDecl::Any
        , rootDeclMgr
    );

    Janitor<DTDElementDecl> rootDeclJanitor(rootDecl);
    rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
    rootDecl->setExternalElemDeclaration(true);
    if(!fUseCachedGrammar)
    {
        fGrammar->putElemDecl(rootDecl);
        rootDeclJanitor.release();
    } else
    {
        // put this in the undeclared pool so it gets deleted...
        XMLElementDecl* elemDecl = fDTDElemNonDeclPool->getByKey(bbRootName.getRawBuffer());
        if (elemDecl)
        {
            rootDecl->setId(elemDecl->getId());
        }
        else
        {
            rootDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)rootDecl));
            rootDeclJanitor.release();
        }
    }

    // Skip any spaces after the name
    fReaderMgr.skipPastSpaces();

    //  And now if we are looking at a >, then we are done. It is not
    //  required to have an internal or external subset, though why you
    //  would not escapes me.
    if (fReaderMgr.skippedChar(chCloseAngle)) {

        //  If we have a doc type handler and advanced callbacks are enabled,
        //  call the doctype event.
        if (fDocTypeHandler)
            fDocTypeHandler->doctypeDecl(*rootDecl, 0, 0, false);
        return;
    }

    // either internal/external subset
    if (fValScheme == Val_Auto && !fValidate)
        fValidate = true;

    bool    hasIntSubset = false;
    bool    hasExtSubset = false;
    XMLCh*  sysId = 0;
    XMLCh*  pubId = 0;

    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    //  If the next character is '[' then we have no external subset cause
    //  there is no system id, just the opening character of the internal
    //  subset. Else, has to be an id.
    //
    // Just look at the next char, don't eat it.
    if (fReaderMgr.peekNextChar() == chOpenSquare)
    {
        hasIntSubset = true;
    }
    else
    {
        // Indicate we have an external subset
        hasExtSubset = true;
        fHasNoDTD = false;

        // Get buffers for the ids
        XMLBufBid bbPubId(&fBufMgr);
        XMLBufBid bbSysId(&fBufMgr);

        // Get the external subset id
        if (!dtdScanner.scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), DTDScanner::IDType_External))
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // Get copies of the ids we got
        pubId = XMLString::replicate(bbPubId.getRawBuffer(), fMemoryManager);
        sysId = XMLString::replicate(bbSysId.getRawBuffer(), fMemoryManager);

        // Skip spaces and check again for the opening of an internal subset
        fReaderMgr.skipPastSpaces();

        // Just look at the next char, don't eat it.
        if (fReaderMgr.peekNextChar() == chOpenSquare) {
            hasIntSubset = true;
        }
    }

    // Insure that the ids get cleaned up, if they got allocated
    ArrayJanitor<XMLCh> janSysId(sysId, fMemoryManager);
    ArrayJanitor<XMLCh> janPubId(pubId, fMemoryManager);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler)
        fDocTypeHandler->doctypeDecl(*rootDecl, pubId, sysId, hasIntSubset, hasExtSubset);

    //  Ok, if we had an internal subset, we are just past the [ character
    //  and need to parse that first.
    if (hasIntSubset)
    {
        // Eat the opening square bracket
        fReaderMgr.getNextChar();

        checkInternalDTD(hasExtSubset, sysId, pubId);

        //  And try to scan the internal subset. If we fail, try to recover
        //  by skipping forward tot he close angle and returning.
        if (!dtdScanner.scanInternalSubset())
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        //  Do a sanity check that some expanded PE did not propogate out of
        //  the doctype. This could happen if it was terminated early by bad
        //  syntax.
        if (fReaderMgr.getReaderDepth() > 1)
        {
            emitError(XMLErrs::PEPropogated);

            // Ask the reader manager to pop back down to the main level
            fReaderMgr.cleanStackBackTo(1);
        }

        fReaderMgr.skipPastSpaces();
    }

    // And that should leave us at the closing > of the DOCTYPE line
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        //  Do a special check for the common scenario of an extra ] char at
        //  the end. This is easy to recover from.
        if (fReaderMgr.skippedChar(chCloseSquare)
        &&  fReaderMgr.skippedChar(chCloseAngle))
        {
            emitError(XMLErrs::ExtraCloseSquare);
        }
         else
        {
            emitError(XMLErrs::UnterminatedDOCTYPE);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }

    //  If we had an external subset, then we need to deal with that one
    //  next. If we are reusing the validator, then don't scan it.
    if (hasExtSubset) {

        InputSource* srcUsed=0;
        Janitor<InputSource> janSrc(srcUsed);
        // If we had an internal subset and we're using the cached grammar, it
        // means that the ignoreCachedDTD is set, so we ignore the cached
        // grammar
        if (fUseCachedGrammar && !hasIntSubset)
        {
            srcUsed = resolveSystemId(sysId, pubId);
            if (srcUsed) {
                janSrc.reset(srcUsed);
                Grammar* grammar = fGrammarResolver->getGrammar(srcUsed->getSystemId());

                if (grammar && grammar->getGrammarType() == Grammar::DTDGrammarType) {

                    fDTDGrammar = (DTDGrammar*) grammar;
                    fGrammar = fDTDGrammar;
                    fValidator->setGrammar(fGrammar);
                    // If we don't report at least the external subset boundaries,
                    // an advanced document handler cannot know when the DTD end,
                    // since we've already sent a doctype decl that indicates there's
                    // there's an external subset.
                    if (fDocTypeHandler)
                    {
                        fDocTypeHandler->startExtSubset();
                        fDocTypeHandler->endExtSubset();
                    }

                    return;
                }
            }
        }

        if (fLoadExternalDTD || fValidate)
        {
            // And now create a reader to read this entity
            XMLReader* reader;
            if(srcUsed) {
                reader = fReaderMgr.createReader
                        (
                            *srcUsed
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , fCalculateSrcOfs
                            , fLowWaterMark
                        );
            }
            else {
                reader = fReaderMgr.createReader
                        (
                            sysId
                            , pubId
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , srcUsed
                            , fCalculateSrcOfs
                            , fLowWaterMark
                            , fDisableDefaultEntityResolution
                        );
                janSrc.reset(srcUsed);
            }
            //  If it failed then throw an exception
            if (!reader)
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenDTD, srcUsed ? srcUsed->getSystemId() : sysId, fMemoryManager);

            if (fToCacheGrammar) {

                unsigned int stringId = fGrammarResolver->getStringPool()->addOrFind(srcUsed->getSystemId());
                const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(stringId);

                fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
                ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
                fGrammarResolver->putGrammar(fGrammar);
            }

            //  In order to make the processing work consistently, we have to
            //  make this look like an external entity. So create an entity
            //  decl and fill it in and push it with the reader, as happens
            //  with an external entity. Put a janitor on it to insure it gets
            //  cleaned up. The reader manager does not adopt them.
            const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
            DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
            declDTD->setSystemId(sysId);
            declDTD->setIsExternal(true);

            // Mark this one as a throw at end
            reader->setThrowAtEnd(true);

            // And push it onto the stack, with its pseudo name
            fReaderMgr.pushReaderAdoptEntity(reader, declDTD);

            // Tell it its not in an include section
            dtdScanner.scanExtSubsetDecl(false, true);
        }
    }
}